

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void binary_transform_reduce_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int iVar1;
  code *pcVar2;
  double dVar3;
  char extraout_AL;
  long lVar4;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int sol;
  int sum;
  undefined8 local_358;
  vector<Data,_std::allocator<Data>_> vec1;
  ResultBuilder DOCTEST_RB;
  Task stask;
  iterator end2;
  iterator beg2;
  iterator end1;
  iterator beg1;
  vector<Data,_std::allocator<Data>_> vec2;
  shared_ptr<tf::WorkerInterface> local_278;
  Expression_lhs<const_int_&> local_260;
  Node *local_250;
  String local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_278);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_278.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  std::vector<Data,_std::allocator<Data>_>::vector(&vec1,1000,(allocator_type *)&DOCTEST_RB);
  std::vector<Data,_std::allocator<Data>_>::vector(&vec2,1000,(allocator_type *)&DOCTEST_RB);
  local_358 = 1;
  do {
    if ((ulong)((long)vec1.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec1.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= (ulong)local_358) {
      std::_Vector_base<Data,_std::allocator<Data>_>::~_Vector_base
                (&vec2.super__Vector_base<Data,_std::allocator<Data>_>);
      std::_Vector_base<Data,_std::allocator<Data>_>::~_Vector_base
                (&vec1.super__Vector_base<Data,_std::allocator<Data>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 4) {
      iVar1 = *(int *)((long)&DAT_0015aca8 + lVar4);
      sol = 100;
      beg1._M_current =
           vec1.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      end1._M_current =
           vec1.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      beg2._M_current =
           vec2.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      end2._M_current =
           vec2.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      sum = sol;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData._8_8_ = &vec1;
      DOCTEST_RB.super_AssertData._24_8_ = &local_358;
      DOCTEST_RB.super_AssertData._40_2_ = SUB82(&vec2,0);
      DOCTEST_RB.super_AssertData._42_2_ = SUB82((ulong)&vec2 >> 0x10,0);
      DOCTEST_RB.super_AssertData._44_4_ = SUB84((ulong)&vec2 >> 0x20,0);
      DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr = (char *)&end2;
      DOCTEST_RB.super_AssertData.m_exception.field_0._8_8_ = &sum;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg1;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end1;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&beg2;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1339:37),_nullptr>
                ((FlowBuilder *)&stask,(anon_class_64_8_98fd1da9 *)&taskflow);
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sol;
      DOCTEST_RB.super_AssertData._44_4_ = 0x3c23d70a;
      DOCTEST_RB.super_AssertData.m_exception.field_0._0_4_ = 0x3f000000;
      DOCTEST_RB.super_AssertData._8_8_ = (TestCaseData *)&beg1;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end1;
      DOCTEST_RB.super_AssertData._24_8_ = &beg2;
      DOCTEST_RB.super_AssertData.m_expr = (char *)(long)iVar1;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_reduce_hpp:281:10),_nullptr>
                ((FlowBuilder *)&local_250,(anon_class_64_7_62696a27 *)&taskflow);
      tf::Node::_precede(stask._node,local_250);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0._0_4_ =
           DOCTEST_RB.super_AssertData.m_exception.field_0._0_4_ & 0xffffff00;
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_260.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x552;
      DOCTEST_RB.super_AssertData.m_expr = "sol == sum";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_260.lhs = &sol;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Result *)&local_250,&local_260,&sum);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&local_250);
      doctest::String::~String(&local_248);
      dVar3 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    }
    local_358 = local_358 + 1;
  } while( true );
}

Assistant:

void binary_transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec1(1000);
  std::vector<Data> vec2(1000);

  for(size_t n=1; n<vec1.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg1 = vec1.end();
      auto end1 = vec1.end();
      auto beg2 = vec2.end();
      auto end2 = vec2.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg1 = vec1.begin();
        end1 = vec1.begin() + n;
        beg2 = vec2.begin();
        end2 = vec2.begin() + n;
        for(auto itr1 = beg1, itr2 = beg2; itr1 != end1 && itr2 != end2; itr1++, itr2++) {
          sum += (itr1->get() + itr2->get());
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg1), std::ref(end1), std::ref(beg2), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data1, const Data& data2) { return data1.get() + data2.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
      
    }
  }
}